

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O2

void LoadSingleBuiltin<Sexp*(*)(Sexp*)>(Sexp *activation,char *name,_func_Sexp_ptr_Sexp_ptr *func)

{
  Environment *symbol;
  size_t extraout_RDX;
  NativeFunction func_00;
  function<Sexp_*(Sexp_*)> local_d8;
  string local_b8;
  NativeFunction local_98;
  undefined1 local_88 [16];
  undefined1 auStack_78 [8];
  f_type stdfnc;
  Sexp *local_50;
  Sexp *activation_local;
  ContractFrameProtector __contract_frame;
  Sexp *alloced_func;
  FrameProtector __frame_prot;
  
  local_50 = activation;
  ContractFrameProtector::ContractFrameProtector
            ((ContractFrameProtector *)&activation_local,"LoadSingleBuiltin");
  ContractFrame::CheckPrecondition
            ((ContractFrame *)activation_local,activation->kind == ACTIVATION,
             "activation->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&alloced_func,"LoadSingleBuiltin");
  FrameProtector::ProtectValue((FrameProtector *)&alloced_func,&local_50,"activation");
  __contract_frame.protected_frame = (ContractFrame *)0x0;
  FrameProtector::ProtectValue
            ((FrameProtector *)&alloced_func,(Sexp **)&__contract_frame,"alloced_func");
  stdfnc.super__Function_base._M_functor._8_8_ = 0;
  stdfnc.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_78 = (undefined1  [8])0x0;
  stdfnc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  if (func != (_func_Sexp_ptr_Sexp_ptr *)0x0) {
    stdfnc.super__Function_base._M_manager =
         std::_Function_handler<Sexp_*(Sexp_*),_Sexp_*(*)(Sexp_*)>::_M_invoke;
    stdfnc.super__Function_base._M_functor._8_8_ =
         std::_Function_handler<Sexp_*(Sexp_*),_Sexp_*(*)(Sexp_*)>::_M_manager;
    auStack_78 = (undefined1  [8])func;
  }
  std::function<Sexp_*(Sexp_*)>::function(&local_d8,(function<Sexp_*(Sexp_*)> *)auStack_78);
  NativeFunction::NativeFunction<Sexp*,Sexp*>(&local_98,&local_d8);
  func_00.arity = extraout_RDX;
  func_00.func = (function<Sexp_*(Sexp_**)> *)local_98.arity;
  __contract_frame.protected_frame =
       (ContractFrame *)GcHeap::AllocateNativeFunction((GcHeap *)local_98.func,func_00);
  std::_Function_base::~_Function_base(&local_d8.super__Function_base);
  symbol = g_the_environment;
  std::__cxx11::string::string
            ((string *)&local_b8,name,(allocator *)((long)&__frame_prot.protected_frame + 7));
  SymbolInterner::InternSymbol(&local_b8);
  Environment::DefineGlobal((Environment *)local_88,(size_t)symbol);
  std::__cxx11::string::~string((string *)&local_b8);
  Activation::Set((local_50->field_1).activation,local_88._8_8_,local_88._0_8_,
                  (Sexp *)__contract_frame.protected_frame);
  std::_Function_base::~_Function_base((_Function_base *)auStack_78);
  FrameProtector::~FrameProtector((FrameProtector *)&alloced_func);
  ContractFrameProtector::~ContractFrameProtector((ContractFrameProtector *)&activation_local);
  return;
}

Assistant:

void LoadSingleBuiltin(Sexp *activation, const char *name, F func) {
  CONTRACT { PRECONDITION(activation->IsActivation()); }